

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

int coda_type_text_set_fixed_value(coda_type_text *type,char *fixed_value)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (type == (coda_type_text *)0x0) {
    pcVar1 = "type argument is NULL (%s:%u)";
    uVar2 = 0x7c3;
  }
  else {
    if (fixed_value != (char *)0x0) {
      if (type->fixed_value != (char *)0x0) {
        coda_set_error(-400,"text type already has a fixed value");
        return -1;
      }
      pcVar1 = strdup(fixed_value);
      type->fixed_value = pcVar1;
      if (pcVar1 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0x7d4);
        return -1;
      }
      return 0;
    }
    pcVar1 = "fixed_value argument is NULL (%s:%u)";
    uVar2 = 0x7c8;
  }
  coda_set_error(-100,pcVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar2);
  return -1;
}

Assistant:

int coda_type_text_set_fixed_value(coda_type_text *type, const char *fixed_value)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (fixed_value == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "fixed_value argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->fixed_value != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "text type already has a fixed value");
        return -1;
    }
    type->fixed_value = strdup(fixed_value);
    if (type->fixed_value == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }

    return 0;
}